

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

void __thiscall kj::UnixEventPort::FdObserver::fire(FdObserver *this,short events)

{
  PromiseFulfiller<void> *pPVar1;
  Disposer *pDVar2;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  
  if ((events & 0x2019U) != 0) {
    (this->atEnd).ptr.field_1.value = (events & 0x2010U) != 0;
    (this->atEnd).ptr.isSet = true;
    pPVar1 = (this->readFulfiller).ptr.ptr;
    if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
      (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_11);
      pDVar2 = (this->readFulfiller).ptr.disposer;
      pPVar1 = (this->readFulfiller).ptr.ptr;
      (this->readFulfiller).ptr.disposer = (Disposer *)0x0;
      (this->readFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
      if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                          (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
      }
    }
  }
  if (((events & 0x1cU) != 0) &&
     (pPVar1 = (this->writeFulfiller).ptr.ptr, pPVar1 != (PromiseFulfiller<void> *)0x0)) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_12);
    pDVar2 = (this->writeFulfiller).ptr.disposer;
    pPVar1 = (this->writeFulfiller).ptr.ptr;
    (this->writeFulfiller).ptr.disposer = (Disposer *)0x0;
    (this->writeFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                        (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
    }
  }
  if (((events & 0x18U) != 0) &&
     (pPVar1 = (this->hupFulfiller).ptr.ptr, pPVar1 != (PromiseFulfiller<void> *)0x0)) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_13);
    pDVar2 = (this->hupFulfiller).ptr.disposer;
    pPVar1 = (this->hupFulfiller).ptr.ptr;
    (this->hupFulfiller).ptr.disposer = (Disposer *)0x0;
    (this->hupFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                        (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
    }
  }
  if (((events & 2U) != 0) &&
     (pPVar1 = (this->urgentFulfiller).ptr.ptr, pPVar1 != (PromiseFulfiller<void> *)0x0)) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_14);
    pDVar2 = (this->urgentFulfiller).ptr.disposer;
    pPVar1 = (this->urgentFulfiller).ptr.ptr;
    (this->urgentFulfiller).ptr.disposer = (Disposer *)0x0;
    (this->urgentFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                        (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
    }
  }
  return;
}

Assistant:

void UnixEventPort::FdObserver::fire(short events) {
  if (events & (EPOLLIN | EPOLLHUP | EPOLLRDHUP | EPOLLERR)) {
    if (events & (EPOLLHUP | EPOLLRDHUP)) {
      atEnd = true;
    } else {
      // Since we didn't receive EPOLLRDHUP, we know that we're not at the end.
      atEnd = false;
    }

    KJ_IF_SOME(f, readFulfiller) {
      f->fulfill();
      readFulfiller = kj::none;
    }
  }

  if (events & (EPOLLOUT | EPOLLHUP | EPOLLERR)) {
    KJ_IF_SOME(f, writeFulfiller) {
      f->fulfill();
      writeFulfiller = kj::none;
    }
  }

  if (events & (EPOLLHUP | EPOLLERR)) {
    KJ_IF_SOME(f, hupFulfiller) {
      f->fulfill();
      hupFulfiller = kj::none;
    }
  }

  if (events & EPOLLPRI) {
    KJ_IF_SOME(f, urgentFulfiller) {
      f->fulfill();
      urgentFulfiller = kj::none;
    }
  }
}